

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O0

size_t IpmiFruWriteMultirecords(FILE *ofd,Exp_EEP_t *exp_eep,uint dynamic_offset,size_t size)

{
  uint uVar1;
  size_t sVar2;
  int local_4c;
  int last_piece;
  int piece_offset;
  int next_size;
  uint8_t block_id;
  int iStack_3c;
  uint16_t instance_id;
  int multirecord_present;
  int res;
  size_t acc_size;
  size_t size_local;
  Exp_EEP_t *pEStack_20;
  uint dynamic_offset_local;
  Exp_EEP_t *exp_eep_local;
  FILE *ofd_local;
  
  _multirecord_present = 0;
  next_size = 0;
  acc_size = size;
  size_local._4_4_ = dynamic_offset;
  pEStack_20 = exp_eep;
  exp_eep_local = (Exp_EEP_t *)ofd;
  if (*(int *)exp_eep->GenId == 0x306d6f43) {
    if (verbose != 0) {
      printf("Encoding COM-Express Carrier description\n");
    }
    IpmiFruEncodeCarrier(pEStack_20,0x31);
    next_size = 1;
  }
  else if (*(int *)exp_eep->GenId == 0x486d6f43) {
    if (verbose != 0) {
      printf("Encoding COM-HPC Carrier description\n");
    }
    IpmiFruEncodeCarrier(pEStack_20,0x4f);
    next_size = 1;
  }
  else if (*(int *)exp_eep->GenId == 0x304d6f63) {
    if (verbose != 0) {
      printf("Encoding COM-Express Module description\n");
    }
    IpmiFruEncodeModule(pEStack_20,0x12);
    next_size = 1;
  }
  else if (*(int *)exp_eep->GenId == 0x484d6f63) {
    if (verbose != 0) {
      printf("Encoding COM-HPC Module description\n");
    }
    IpmiFruEncodeModule(pEStack_20,0x1e);
    next_size = 1;
  }
  piece_offset._2_2_ = 0;
  for (; size_local._4_4_ < acc_size; size_local._4_4_ = last_piece + size_local._4_4_) {
    sVar2 = ParseDynamic(pEStack_20,size_local._4_4_,acc_size,(uint8_t *)((long)&piece_offset + 1));
    last_piece = (int)sVar2;
    if (last_piece < 1) {
      fprintf(_stderr,"Failed to parse a dynamic record at offset %d\n",(ulong)size_local._4_4_);
      return 0xffffffffffffffff;
    }
    if ((piece_offset._1_1_ != 0) && (piece_offset._1_1_ != 0xf2)) {
      local_4c = 0;
      do {
        if (next_size != 0) {
          sVar2 = IpmiFruWritePreparedMultirecord((FILE *)exp_eep_local,0);
          iStack_3c = (int)sVar2;
          if (iStack_3c < 1) {
            return 0xffffffffffffffff;
          }
          _multirecord_present = _multirecord_present + (long)iStack_3c;
        }
        uVar1 = IpmiFruEncodeDynamic
                          (pEStack_20,size_local._4_4_,(long)last_piece,piece_offset._2_2_,&local_4c
                          );
        if (verbose != 0) {
          printf("Encoding dynamic block %x, size=%d, offset=%d, instance=%d, last piece=%d\n",
                 (ulong)piece_offset._1_1_,(ulong)(uint)last_piece,(ulong)size_local._4_4_,
                 (ulong)piece_offset._2_2_,(ulong)uVar1);
        }
        next_size = 1;
      } while (uVar1 == 0);
      piece_offset._2_2_ = piece_offset._2_2_ + 1;
    }
  }
  if (next_size != 0) {
    sVar2 = IpmiFruWritePreparedMultirecord((FILE *)exp_eep_local,1);
    if ((int)sVar2 < 1) {
      return 0xffffffffffffffff;
    }
    _multirecord_present = _multirecord_present + (long)(int)sVar2;
  }
  return _multirecord_present;
}

Assistant:

size_t IpmiFruWriteMultirecords(FILE *ofd, Exp_EEP_t *exp_eep, unsigned int dynamic_offset, size_t size)
{
    size_t acc_size = 0;
    int res;
    BOOL multirecord_present = FALSE;
    
    if (memcmp(exp_eep->GenId, "Com0", 4) == 0) {
        //  Encode Com0 carrier record
        if (verbose) printf("Encoding COM-Express Carrier description\n");
        IpmiFruEncodeCarrier(exp_eep, sizeof(COM0R20_CB_t));
        multirecord_present = TRUE;
    } else if (memcmp(exp_eep->GenId, "ComH", 4) == 0) {
        //  Encode ComH carrier record
        if (verbose) printf("Encoding COM-HPC Carrier description\n");
        IpmiFruEncodeCarrier(exp_eep, sizeof(COMHR10_CB_t));
        multirecord_present = TRUE;
    } else if (memcmp(exp_eep->GenId, "coM0", 4) == 0) {
        //  Encode Com0 module record
        if (verbose) printf("Encoding COM-Express Module description\n");
        IpmiFruEncodeModule(exp_eep, sizeof(COM0R20_M_t));
        multirecord_present = TRUE;
    } else if (memcmp(exp_eep->GenId, "coMH", 4) == 0) {
        //  Encode ComH module record
        if (verbose) printf("Encoding COM-HPC Module description\n");
        IpmiFruEncodeModule(exp_eep, sizeof(COMHR10_M_t));
        multirecord_present = TRUE;
    }
    //  Now encode dynamic records
    uint16_t instance_id = 0;
    while (dynamic_offset < size) {
        uint8_t block_id;
        int next_size = ParseDynamic(exp_eep, dynamic_offset, size, &block_id);
        if (next_size <= 0) {
            fprintf(stderr, "Failed to parse a dynamic record at offset %d\n", dynamic_offset);
            return -1;
        }
        if(block_id != EEEP_BLOCK_ID_UNUSED && block_id != EEEP_BLOCK_ID_CRC_CHK) {
            int piece_offset = 0;
            BOOL last_piece;
            do {
                if (multirecord_present) {
                    if ((res = IpmiFruWritePreparedMultirecord(ofd, FALSE)) <= 0) {                
                        return -1;
                    }
                    acc_size += res;
                }
                last_piece = IpmiFruEncodeDynamic(exp_eep, dynamic_offset, next_size, 
                    instance_id, &piece_offset); 
                if (verbose) printf("Encoding dynamic block %x, size=%d, offset=%d, instance=%d, last piece=%d\n", 
                        block_id, next_size, dynamic_offset, instance_id, last_piece);
                multirecord_present = TRUE;
            } while (!last_piece);
            instance_id ++;
        }
        dynamic_offset += next_size;
    }
    //  Write last record 
    if (multirecord_present) {
        if ((res = IpmiFruWritePreparedMultirecord(ofd, TRUE)) <= 0) {                
            return -1;
        }
        acc_size += res;
    }
    return acc_size;
}